

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol-reader2.hpp
# Opt level: O2

void __thiscall
mp::SOLReader2<ExampleSOLHandler>::serror(SOLReader2<ExampleSOLHandler> *this,char *format,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  allocator_type local_121;
  vector<char,_std::allocator<char>_> buf;
  va_list args;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  args[0].gp_offset = 0x10;
  args[0].fp_offset = 0x30;
  args[0].overflow_arg_area = &stack0x00000008;
  args[0].reg_save_area = local_e8;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  iVar1 = vsnprintf((char *)0x0,0,format,args);
  args[0].gp_offset = 0x10;
  args[0].fp_offset = 0x30;
  args[0].overflow_arg_area = &stack0x00000008;
  args[0].reg_save_area = local_e8;
  std::vector<char,_std::allocator<char>_>::vector(&buf,(long)(iVar1 + 1),&local_121);
  vsnprintf(buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
            _M_start,(long)(iVar1 + 1),format,args);
  if ((this->err_msg_)._M_string_length != 0) {
    std::__cxx11::string::push_back((char)&this->err_msg_);
  }
  std::__cxx11::string::append((char *)&this->err_msg_);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&buf.super__Vector_base<char,_std::allocator<char>_>);
  return;
}

Assistant:

void SOLReader2<SOLHandler>::serror(
    const char* format, ...) {
  va_list args;
  va_start (args, format);
  auto n = std::vsnprintf (0, 0, format, args);
  va_end (args);
  va_start (args, format);
  std::vector<char> buf(n+1);
  auto n1 = std::vsnprintf (buf.data(), n+1, format, args);
  assert(n==n1);
  va_end (args);
  if (err_msg_.size())
    err_msg_ += '\n';
  err_msg_ += buf.data();
}